

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::~PosixMmapReadableFile(PosixMmapReadableFile *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ~PosixMmapReadableFile(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x40);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~PosixMmapReadableFile() override {
    ::munmap(static_cast<void*>(mmap_base_), length_);
    mmap_limiter_->Release();
  }